

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O2

string * __thiscall OIDType::string_abi_cxx11_(OIDType *this)

{
  string *psVar1;
  pointer puVar2;
  size_t sVar3;
  int max_len;
  uint8_t *buf;
  long item;
  char buffer [16];
  long local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  psVar1 = &this->_value;
  if ((this->_value)._M_string_length == 0) {
    puVar2 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::__cxx11::string::assign((char *)psVar1);
    if (this->valid == true) {
      buf = puVar2 + 1;
      for (max_len = ~*(uint *)&(this->data).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start +
                     *(int *)&(this->data).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish; 0 < max_len;
          max_len = max_len - (int)sVar3) {
        local_48 = 0;
        uStack_40 = 0;
        local_50 = 0;
        sVar3 = decode_ber_longform_integer(buf,&local_50,max_len);
        buf = buf + sVar3;
        local_48 = CONCAT71(local_48._1_7_,0x2e);
        long_to_buf((char *)((long)&local_48 + 1),local_50,0);
        std::__cxx11::string::append((char *)psVar1);
      }
    }
  }
  return psVar1;
}

Assistant:

const std::string& OIDType::string() {
    if(!this->_value.length()){
        const uint8_t* dataPtr = this->data.data();

        this->_value = ".1.3";
        if(!this->valid) return this->_value;

        dataPtr++;

        int i = this->data.size() - 1;
        char buffer[16];

        while(i > 0){
            memset(buffer, 0, sizeof(buffer));
            long item = 0;
            int itemLength = decode_ber_longform_integer(dataPtr, &item, i);
            dataPtr += itemLength; i -= itemLength;

            buffer[0] = '.';
            long_to_buf(buffer+1, item);
            this->_value.append(buffer);
        }
    }
    return this->_value;
}